

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node * fy_alias_get_merge_mapping(fy_document *fyd,fy_node *fyn)

{
  _Bool _Var1;
  fy_anchor *pfVar2;
  fy_anchor *fya;
  fy_node *fyn_local;
  fy_document *fyd_local;
  
  _Var1 = fy_node_is_alias(fyn);
  if (_Var1) {
    pfVar2 = fy_document_lookup_anchor_by_token(fyd,(fyn->field_12).scalar);
    if (pfVar2 == (fy_anchor *)0x0) {
      fyd_local = (fy_document *)0x0;
    }
    else if ((pfVar2->fyn->field_0x34 & 3) == 2) {
      fyd_local = (fy_document *)pfVar2->fyn;
    }
    else {
      fyd_local = (fy_document *)0x0;
    }
  }
  else {
    fyd_local = (fy_document *)0x0;
  }
  return (fy_node *)fyd_local;
}

Assistant:

static struct fy_node *fy_alias_get_merge_mapping(struct fy_document *fyd, struct fy_node *fyn) {
    struct fy_anchor *fya;

    /* must be an alias */
    if (!fy_node_is_alias(fyn))
        return NULL;

    /* anchor must exist */
    fya = fy_document_lookup_anchor_by_token(fyd, fyn->scalar);
    if (!fya)
        return NULL;

    /* and it must be a mapping */
    if (fya->fyn->type != FYNT_MAPPING)
        return NULL;

    return fya->fyn;
}